

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  uint uVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  byte in_CL;
  ushort in_DX;
  ushort in_SI;
  ImFont *in_RDI;
  uint index_size;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  float local_28;
  unsigned_short uVar4;
  int in_stack_ffffffffffffffdc;
  
  if ((in_RDI->IndexLookup).Size < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0xab0,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  uVar1 = (in_RDI->IndexLookup).Size;
  if ((((uVar1 <= in_SI) || ((in_RDI->IndexLookup).Data[in_SI] != 0xffff)) || ((in_CL & 1) != 0)) &&
     ((in_DX < uVar1 || (in_SI < uVar1)))) {
    GrowIndex(in_RDI,in_stack_ffffffffffffffdc);
    if (in_DX < uVar1) {
      uVar4 = (in_RDI->IndexLookup).Data[in_DX];
    }
    else {
      uVar4 = 0xffff;
    }
    puVar2 = ImVector<unsigned_short>::operator[]
                       ((ImVector<unsigned_short> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    *puVar2 = uVar4;
    if (in_DX < uVar1) {
      local_28 = (in_RDI->IndexAdvanceX).Data[in_DX];
    }
    else {
      local_28 = 1.0;
    }
    pfVar3 = ImVector<float>::operator[]
                       ((ImVector<float> *)CONCAT44(local_28,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    *pfVar3 = local_28;
  }
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}